

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

UBool __thiscall icu_63::OlsonTimeZone::operator==(OlsonTimeZone *this,TimeZone *other)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  
  if (this == (OlsonTimeZone *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if (((__s1 == __s2) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)))) &&
     (UVar1 = TimeZone::operator==((TimeZone *)this,other), UVar1 != '\0')) {
    iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xb])
                      (this,other);
    return (char)iVar2 != '\0';
  }
  return '\0';
}

Assistant:

UBool OlsonTimeZone::operator==(const TimeZone& other) const {
    return ((this == &other) ||
            (typeid(*this) == typeid(other) &&
            TimeZone::operator==(other) &&
            hasSameRules(other)));
}